

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree.h
# Opt level: O2

btree_node<phmap::priv::set_params<int,_std::greater<int>,_std::allocator<int>,_256,_false>_> *
phmap::priv::
btree_node<phmap::priv::set_params<int,_std::greater<int>,_std::allocator<int>,_256,_false>_>::
init_internal(btree_node<phmap::priv::set_params<int,_std::greater<int>,_std::allocator<int>,_256,_false>_>
              *n,btree_node<phmap::priv::set_params<int,_std::greater<int>,_std::allocator<int>,_256,_false>_>
                 *parent)

{
  template_ElementType<1UL> *ptVar1;
  
  init_leaf(n,parent,0x3d);
  ptVar1 = btree_node<phmap::priv::set_params<int,std::greater<int>,std::allocator<int>,256,false>>
           ::GetField<1ul>((btree_node<phmap::priv::set_params<int,std::greater<int>,std::allocator<int>,256,false>>
                            *)n);
  ptVar1[3] = '\0';
  btree_node<phmap::priv::set_params<int,std::greater<int>,std::allocator<int>,256,false>>::
  GetField<3ul>((btree_node<phmap::priv::set_params<int,std::greater<int>,std::allocator<int>,256,false>>
                 *)n);
  return n;
}

Assistant:

static btree_node *init_internal(btree_node *n, btree_node *parent) {
            init_leaf(n, parent, kNodeValues);
            // Set `max_count` to a sentinel value to indicate that this node is
            // internal.
            n->set_max_count(kInternalNodeMaxCount);
            phmap::priv::SanitizerPoisonMemoryRegion(
                &n->mutable_child(0), (kNodeValues + 1) * sizeof(btree_node *));
            return n;
        }